

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToEquivClass
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  undefined4 uVar2;
  CharSet<char16_t> *this_00;
  CharSet<char16_t> *allocator_00;
  bool bVar3;
  Char kc;
  uint uVar4;
  uint h;
  int local_38;
  char16 local_34 [2];
  int j;
  Char equivs [4];
  uint acth;
  uint i;
  uint tblidx;
  CharSet<char16_t> *result_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  acth = 0;
  _i = result;
  result_local = (CharSet<char16_t> *)allocator;
  allocator_local = (ArenaAllocator *)this;
  bVar3 = IsCompact(this);
  if (bVar3) {
    Sort(this);
    equivs[2] = L'\0';
    equivs[3] = L'\0';
    for (; uVar2 = equivs._4_4_, uVar4 = GetCompactLength(this), (uint)uVar2 < uVar4;
        equivs._4_4_ = equivs._4_4_ + 1) {
      uVar4 = GetCompactCharU(this,equivs._4_4_);
      h = GetCompactCharU(this,equivs._4_4_);
      bVar3 = CaseInsensitive::RangeToEquivClass(&acth,uVar4,h,(uint *)equivs,local_34);
      allocator_00 = result_local;
      this_00 = _i;
      if (bVar3) {
        for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
          Set(_i,(ArenaAllocator *)result_local,local_34[local_38]);
        }
      }
      else {
        kc = GetCompactChar(this,equivs._4_4_);
        Set(this_00,(ArenaAllocator *)allocator_00,kc);
      }
    }
  }
  else {
    CharBitvec::ToEquivClass<char16_t>
              (&(this->rep).full.direct,(ArenaAllocator *)result_local,0,&acth,_i,0);
    if ((this->rep).compact.countPlusOne != 0) {
      pCVar1 = (this->rep).full.root;
      (*pCVar1->_vptr_CharSetNode[7])(pCVar1,result_local,2,0,&acth,_i);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::ToEquivClass(ArenaAllocator* allocator, CharSet<Char>& result)
    {
        uint tblidx = 0;
        if (IsCompact())
        {
            Sort();
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                uint acth;
                Char equivs[CaseInsensitive::EquivClassSize];
                if (CaseInsensitive::RangeToEquivClass(tblidx, this->GetCompactCharU(i), this->GetCompactCharU(i), acth, equivs))
                {
                    for (int j = 0; j < CaseInsensitive::EquivClassSize; j++)
                    {
                        result.Set(allocator, equivs[j]);
                    }
                }
                else
                {
                    result.Set(allocator, this->GetCompactChar(i));
                }
            }
        }
        else
        {
            rep.full.direct.ToEquivClass<char16>(allocator, 0, tblidx, result);
            if (rep.full.root != nullptr)
            {
                rep.full.root->ToEquivClassW(allocator, CharSetNode::levels - 1, 0, tblidx, result);
            }
        }
    }